

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O3

void ApplicativeHelper::getHeadAndArgs(TermList term,TermList *head,TermStack *args)

{
  uint64_t uVar1;
  bool bVar2;
  TermList *pTVar3;
  TermList local_30;
  
  if (args->_cursor != args->_stack) {
    args->_cursor = args->_stack;
  }
  local_30._content = term._content;
  bVar2 = Kernel::TermList::isApplication(&local_30);
  if (bVar2) {
    do {
      uVar1 = *(uint64_t *)
               (local_30._content + 0x10 +
               (ulong)(*(uint *)(local_30._content + 0xc) & 0xfffffff) * 8);
      pTVar3 = args->_cursor;
      if (pTVar3 == args->_end) {
        Lib::Stack<Kernel::TermList>::expand(args);
        pTVar3 = args->_cursor;
      }
      pTVar3->_content = uVar1;
      args->_cursor = pTVar3 + 1;
      local_30._content =
           *(uint64_t *)
            (local_30._content + 0x18 + (ulong)(*(uint *)(local_30._content + 0xc) & 0xfffffff) * 8)
      ;
      bVar2 = Kernel::TermList::isApplication(&local_30);
    } while (bVar2);
  }
  head->_content = (uint64_t)local_30;
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(TermList term, TermList& head, TermStack& args)
{
  if(!args.isEmpty()){ args.reset(); }

  while(term.isApplication()){
    args.push(*term.term()->nthArgument(3)); 
    term = *term.term()->nthArgument(2);
  }
  head = term;

}